

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::SetUseUtf8StringEscaping(Printer *this,bool as_utf8)

{
  FieldValuePrinter *pFVar1;
  FieldValuePrinter *this_00;
  undefined3 in_register_00000031;
  
  this_00 = (FieldValuePrinter *)operator_new(8);
  if (CONCAT31(in_register_00000031,as_utf8) == 0) {
    FieldValuePrinter::FieldValuePrinter(this_00);
  }
  else {
    this_00->_vptr_FieldValuePrinter = (_func_int **)&PTR__FieldValuePrinter_00427a18;
  }
  pFVar1 = (this->default_field_value_printer_).ptr_;
  if (pFVar1 != this_00) {
    if (pFVar1 != (FieldValuePrinter *)0x0) {
      (*pFVar1->_vptr_FieldValuePrinter[1])();
    }
    (this->default_field_value_printer_).ptr_ = this_00;
  }
  return;
}

Assistant:

void TextFormat::Printer::SetUseUtf8StringEscaping(bool as_utf8) {
  SetDefaultFieldValuePrinter(as_utf8
                              ? new FieldValuePrinterUtf8Escaping()
                              : new FieldValuePrinter());
}